

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O3

void rsg::copyVarying<64>(ValueAccess dst,ConstStridedValueAccess<64> src,int compNdx)

{
  Scalar SVar1;
  TestError *this;
  long lVar2;
  VariableType *this_00;
  int iVar3;
  
  this_00 = dst.super_ConstStridedValueAccess<1>.m_type;
  if (this_00->m_baseType == TYPE_FLOAT) {
    if (0 < this_00->m_numElements) {
      iVar3 = 0;
      lVar2 = 0;
      do {
        VariableType::getElementType(src.m_type);
        SVar1 = src.m_value[(long)compNdx + (long)iVar3];
        VariableType::getElementType(this_00);
        dst.super_ConstStridedValueAccess<1>.m_value[lVar2] = SVar1;
        lVar2 = lVar2 + 1;
        iVar3 = iVar3 + 0x40;
      } while (lVar2 < this_00->m_numElements);
    }
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"dst.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0xa2);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void copyVarying (ValueAccess dst, ConstStridedValueAccess<Stride> src, int compNdx)
{
	TCU_CHECK(dst.getType().getBaseType() == VariableType::TYPE_FLOAT);
	for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
		dst.component(elemNdx).asFloat() = src.component(elemNdx).asFloat(compNdx);
}